

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O2

bool __thiscall DIntermissionController::NextPage(DIntermissionController *this)

{
  uint uVar1;
  FIntermissionAction *pFVar2;
  PClass *this_00;
  DIntermissionScreen *pDVar3;
  FIntermissionDescriptor *pFVar4;
  FIntermissionDescriptor **ppFVar5;
  DObject *pDVar6;
  long lVar7;
  undefined8 unaff_R13;
  ulong uVar8;
  TObjPtr<DIntermissionScreen> *obj;
  int unaff_R15D;
  FName local_44;
  int local_40;
  uint local_3c;
  TObjPtr<DIntermissionScreen> *local_38;
  
  if ((this->mIndex !=
       (this->mDesc->mActions).super_TArray<FIntermissionAction_*,_FIntermissionAction_*>.Count) ||
     ((this->mDesc->mLink).Index != 0)) {
    obj = &this->mScreen;
    pDVar3 = GC::ReadBarrier<DIntermissionScreen>((DIntermissionScreen **)obj);
    if (pDVar3 == (DIntermissionScreen *)0x0) {
      uVar8 = 0;
    }
    else {
      pDVar3 = GC::ReadBarrier<DIntermissionScreen>((DIntermissionScreen **)obj);
      uVar8 = CONCAT71((int7)((ulong)unaff_R13 >> 8),pDVar3->mFlatfill);
      unaff_R15D = (pDVar3->mBackground).texnum;
      pDVar3 = GC::ReadBarrier<DIntermissionScreen>((DIntermissionScreen **)obj);
      (*(pDVar3->super_DObject)._vptr_DObject[4])(pDVar3);
    }
    pFVar4 = this->mDesc;
    lVar7 = (long)this->mIndex;
    while( true ) {
      uVar1 = (pFVar4->mActions).super_TArray<FIntermissionAction_*,_FIntermissionAction_*>.Count;
      for (; (uint)lVar7 < uVar1; lVar7 = lVar7 + 1) {
        this->mIndex = (uint)lVar7 + 1;
        pFVar2 = (pFVar4->mActions).super_TArray<FIntermissionAction_*,_FIntermissionAction_*>.Array
                 [lVar7];
        this_00 = pFVar2->mClass;
        if (this_00 != (PClass *)0xffffffffffffffff) {
          if (this_00 == (PClass *)0xfffffffffffffffe) {
            (*(this->super_DObject)._vptr_DObject[4])(this);
            D_StartTitle();
            return false;
          }
          pDVar6 = PClass::CreateNew(this_00);
          (this->mScreen).field_0.o = pDVar6;
          pDVar3 = GC::ReadBarrier<DIntermissionScreen>((DIntermissionScreen **)obj);
          (pDVar3->mBackground).texnum = unaff_R15D;
          pDVar3->mFlatfill = SUB81(uVar8,0);
          pDVar3 = GC::ReadBarrier<DIntermissionScreen>((DIntermissionScreen **)obj);
          (*(pDVar3->super_DObject)._vptr_DObject[7])(pDVar3,pFVar2,(ulong)this->mFirst);
          this->mFirst = false;
          return true;
        }
        wipegamestate = *(gamestate_t *)&pFVar2[1]._vptr_FIntermissionAction;
      }
      local_44.Index = (pFVar4->mLink).Index;
      if ((local_44.Index == 0) ||
         (local_38 = obj,
         ppFVar5 = TMap<FName,_FIntermissionDescriptor_*,_THashTraits<FName>,_TValueTraits<FIntermissionDescriptor_*>_>
                   ::CheckKey(&IntermissionDescriptors,&local_44),
         ppFVar5 == (FIntermissionDescriptor **)0x0)) break;
      if (this->mDeleteDesc == true) {
        local_3c = (uint)uVar8;
        pFVar4 = this->mDesc;
        local_40 = unaff_R15D;
        if (pFVar4 != (FIntermissionDescriptor *)0x0) {
          TDeletingArray<FIntermissionAction_*,_FIntermissionAction_*>::~TDeletingArray
                    (&pFVar4->mActions);
        }
        operator_delete(pFVar4,0x18);
        uVar8 = (ulong)local_3c;
        unaff_R15D = local_40;
      }
      this->mDeleteDesc = false;
      this->mIndex = 0;
      pFVar4 = *ppFVar5;
      this->mDesc = pFVar4;
      lVar7 = 0;
      obj = local_38;
    }
  }
  return false;
}

Assistant:

bool DIntermissionController::NextPage ()
{
	FTextureID bg;
	bool fill = false;

	if (mIndex == (int)mDesc->mActions.Size() && mDesc->mLink == NAME_None)
	{
		// last page
		return false;
	}

	if (mScreen != NULL)
	{
		bg = mScreen->GetBackground(&fill);
		mScreen->Destroy();
	}
again:
	while ((unsigned)mIndex < mDesc->mActions.Size())
	{
		FIntermissionAction *action = mDesc->mActions[mIndex++];
		if (action->mClass == WIPER_ID)
		{
			wipegamestate = static_cast<FIntermissionActionWiper*>(action)->mWipeType;
		}
		else if (action->mClass == TITLE_ID)
		{
			Destroy();
			D_StartTitle ();
			return false;
		}
		else
		{
			// create page here
			mScreen = (DIntermissionScreen*)action->mClass->CreateNew();
			mScreen->SetBackground(bg, fill);	// copy last screen's background before initializing
			mScreen->Init(action, mFirst);
			mFirst = false;
			return true;
		}
	}
	if (mDesc->mLink != NAME_None)
	{
		FIntermissionDescriptor **pDesc = IntermissionDescriptors.CheckKey(mDesc->mLink);
		if (pDesc != NULL)
		{
			if (mDeleteDesc) delete mDesc;
			mDeleteDesc = false;
			mIndex = 0;
			mDesc = *pDesc;
			goto again;
		}
	}
	return false;
}